

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void object_suite::fail_missing_colon(void)

{
  bool bVar1;
  error_code eVar2;
  char input [8];
  reader reader;
  uint local_174;
  view_type local_170;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"{\"key\"}",8);
  local_170._M_len = strlen(local_160);
  local_170._M_str = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x327,"void object_suite::fail_missing_colon()",&local_170,&local_174);
  if ((long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_170._M_len =
         ((long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    local_174 = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("reader.level()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x328,"void object_suite::fail_missing_colon()",&local_170,&local_174);
    bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
    local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
    local_174 = CONCAT31(local_174._1_3_,1);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
              ("reader.next()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x329,"void object_suite::fail_missing_colon()",&local_170,&local_174);
    local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
    local_174 = 0xb;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
              ("reader.code()","token::code::key",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x32a,"void object_suite::fail_missing_colon()",&local_170,&local_174);
    if ((long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_170._M_len =
           ((long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_158.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
      local_174 = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                ("reader.level()","1",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x32b,"void object_suite::fail_missing_colon()",&local_170,&local_174);
      bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
      local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
      local_174 = local_174 & 0xffffff00;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                ("reader.next()","false",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x32c,"void object_suite::fail_missing_colon()",&local_170,&local_174);
      local_174 = 0xffffffff;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                ("reader.code()","token::code::error_unexpected_token",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x32d,"void object_suite::fail_missing_colon()",&local_170,&local_174);
      eVar2 = trial::protocol::json::detail::basic_decoder<char>::error(&local_158.decoder);
      local_170._M_str = (char *)eVar2._M_cat;
      local_170._M_len = CONCAT44(local_170._M_len._4_4_,eVar2._M_value);
      local_174 = 1;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
                ("reader.error()","json::unexpected_token",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x32e,"void object_suite::fail_missing_colon()",&local_170,&local_174);
      if (local_158.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("stack.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/json/detail/reader.ipp"
                ,0x107,
                "size_type trial::protocol::json::basic_reader<char>::level() const [CharT = char]")
  ;
}

Assistant:

void fail_missing_colon()
{
    const char input[] = "{\"key\"}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
}